

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O2

void __thiscall TasGrid::GridFourier::loadNeededValues(GridFourier *this,double *vals)

{
  MultiIndexSet *old_set;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  clearGpuCoefficients(this);
  old_set = &(this->super_BaseCanonicalGrid).points;
  if (((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    StorageSet::setValues(&(this->super_BaseCanonicalGrid).values,vals);
  }
  else {
    StorageSet::addValues
              (&(this->super_BaseCanonicalGrid).values,old_set,
               &(this->super_BaseCanonicalGrid).needed,vals);
  }
  acceptUpdatedTensors(this);
  calculateFourierCoefficients(this);
  MultiIndexManipulations::getMaxIndexes((vector<int,_std::allocator<int>_> *)&local_30,old_set);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->max_power,&local_30);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void GridFourier::loadNeededValues(const double *vals){
    clearGpuCoefficients(); // changing values and Fourier coefficients, clear the cache
    if (points.empty() || needed.empty()){
        values.setValues(vals);
    }else{
        values.addValues(points, needed, vals);
    }

    acceptUpdatedTensors();
    calculateFourierCoefficients();

    max_power = MultiIndexManipulations::getMaxIndexes(points);
}